

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O2

Vec_Int_t * Ssc_GiaGetOneSim(Gia_Man_t *p)

{
  uint uVar1;
  ulong uVar2;
  word *pwVar3;
  Vec_Int_t *pVVar4;
  int *__ptr;
  Gia_Obj_t *pObj;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar6 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
  uVar11 = uVar6 & 0xffffffff;
  pwVar3 = Ssc_GiaGetCareMask(p);
  iVar5 = 0;
  if ((int)uVar6 < 1) {
    uVar11 = 0;
  }
  uVar6 = 0;
  do {
    if (uVar11 == uVar6) {
      uVar10 = 0xffffffff;
LAB_0051701d:
      free(pwVar3);
      if (uVar10 == 0xffffffff) {
        pVVar4 = (Vec_Int_t *)0x0;
      }
      else {
        pVVar4 = (Vec_Int_t *)malloc(0x10);
        pVVar4->nCap = 100;
        pVVar4->nSize = 0;
        __ptr = (int *)malloc(400);
        pVVar4->pArray = __ptr;
        uVar6 = 100;
        lVar9 = 0;
        while ((iVar5 = (int)lVar9, iVar5 < p->vCis->nSize &&
               (pObj = Gia_ManCi(p,iVar5), pObj != (Gia_Obj_t *)0x0))) {
          pwVar3 = Gia_ObjSimObj(p,pObj);
          uVar1 = *(uint *)((long)pwVar3 + (long)((int)uVar10 >> 5) * 4);
          iVar7 = (int)uVar6;
          if (iVar5 == iVar7) {
            uVar11 = (ulong)(uint)(iVar7 * 2);
            if (iVar7 < 0x10) {
              uVar11 = 0x10;
            }
            if (iVar7 < (int)uVar11) {
              if (__ptr == (int *)0x0) {
                __ptr = (int *)malloc(uVar11 << 2);
              }
              else {
                __ptr = (int *)realloc(__ptr,uVar11 << 2);
              }
              pVVar4->pArray = __ptr;
              if (__ptr == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar4->nCap = (int)uVar11;
              uVar6 = uVar11;
            }
          }
          __ptr[lVar9] = (uint)((uVar1 >> (uVar10 & 0x1f) & 1) != 0);
          lVar9 = lVar9 + 1;
          pVVar4->nSize = (int)lVar9;
        }
      }
      return pVVar4;
    }
    uVar2 = pwVar3[uVar6];
    if (uVar2 != 0) {
      bVar12 = (int)uVar2 == 0;
      uVar6 = uVar2 >> 0x20;
      if (!bVar12) {
        uVar6 = uVar2;
      }
      iVar8 = (uint)bVar12 * 0x20;
      iVar7 = iVar8 + 0x10;
      uVar11 = uVar6 >> 0x10;
      if ((short)uVar6 != 0) {
        iVar7 = iVar8;
        uVar11 = uVar6;
      }
      iVar8 = iVar7 + 8;
      uVar6 = uVar11 >> 8;
      if ((char)uVar11 != '\0') {
        iVar8 = iVar7;
        uVar6 = uVar11;
      }
      iVar7 = iVar8 + 4;
      uVar11 = uVar6 >> 4;
      if ((uVar6 & 0xf) != 0) {
        iVar7 = iVar8;
        uVar11 = uVar6;
      }
      uVar10 = (uint)(uVar11 >> 2) & 0x3fffffff;
      iVar8 = iVar7 + 2;
      if ((uVar11 & 3) != 0) {
        uVar10 = (uint)uVar11;
        iVar8 = iVar7;
      }
      uVar10 = ((~uVar10 & 1) + iVar8) - iVar5;
      goto LAB_0051701d;
    }
    uVar6 = uVar6 + 1;
    iVar5 = iVar5 + -0x40;
  } while( true );
}

Assistant:

Vec_Int_t * Ssc_GiaGetOneSim( Gia_Man_t * p )
{
    Vec_Int_t * vInit;
    Gia_Obj_t * pObj;
    int i, iBit, nWords = Gia_ObjSimWords( p );
    word * pRes = Ssc_GiaGetCareMask( p );
    iBit = Ssc_SimFindBit( pRes, nWords );
    ABC_FREE( pRes );
    if ( iBit == -1 )
        return NULL;
    vInit = Vec_IntAlloc( 100 );
    Gia_ManForEachCi( p, pObj, i )
        Vec_IntPush( vInit, Abc_InfoHasBit((unsigned *)Gia_ObjSimObj(p, pObj), iBit) );
    return vInit;
}